

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::engine_mode_write
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this,uint8_t data)

{
  uint32_t uVar1;
  byte local_1d;
  undefined1 local_18 [3];
  uint8_t reset_mask;
  uint32_t dummy2;
  uint32_t dummy1;
  uint8_t data_local;
  fm_engine_base<ymfm::opn_registers_base<true>_>_conflict *this_local;
  
  this->m_modified_channels = 0x3f;
  dummy2._3_1_ = data;
  _dummy1 = this;
  opn_registers_base<true>::write(&this->m_regs,0x27,(void *)(ulong)data,(size_t)local_18);
  uVar1 = fm_registers_base::irq_reset((fm_registers_base *)&this->m_regs);
  if (uVar1 == 0) {
    local_1d = 0;
    uVar1 = opn_registers_base<true>::reset_timer_b(&this->m_regs);
    if (uVar1 != 0) {
      local_1d = 2;
    }
    uVar1 = opn_registers_base<true>::reset_timer_a(&this->m_regs);
    if (uVar1 != 0) {
      local_1d = local_1d | 1;
    }
    set_reset_status(this,'\0',local_1d);
    uVar1 = opn_registers_base<true>::load_timer_b(&this->m_regs);
    update_timer(this,1,uVar1,-(this->m_total_clocks & 0xf));
    uVar1 = opn_registers_base<true>::load_timer_a(&this->m_regs);
    update_timer(this,0,uVar1,0);
  }
  else {
    set_reset_status(this,'\0','x');
  }
  return;
}

Assistant:

void fm_engine_base<RegisterType>::engine_mode_write(uint8_t data)
{
	// mark all channels as modified
	m_modified_channels = ALL_CHANNELS;

	// actually write the mode register now
	uint32_t dummy1, dummy2;
	m_regs.write(RegisterType::REG_MODE, data, dummy1, dummy2);

	// reset IRQ status -- when written, all other bits are ignored
	// QUESTION: should this maybe just reset the IRQ bit and not all the bits?
	//   That is, check_interrupts would only set, this would only clear?
	if (m_regs.irq_reset())
		set_reset_status(0, 0x78);
	else
	{
		// reset timer status
		uint8_t reset_mask = 0;
		if (m_regs.reset_timer_b())
			reset_mask |= RegisterType::STATUS_TIMERB;
		if (m_regs.reset_timer_a())
			reset_mask |= RegisterType::STATUS_TIMERA;
		set_reset_status(0, reset_mask);

		// load timers; note that timer B gets a small negative adjustment because
		// the *16 multiplier is free-running, so the first tick of the clock
		// is a bit shorter
		update_timer(1, m_regs.load_timer_b(), -(m_total_clocks & 15));
		update_timer(0, m_regs.load_timer_a(), 0);
	}
}